

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorKeys_test.cpp
# Opt level: O3

void __thiscall jbcoin::tests::ValidatorKeys_test::testMakeValidatorKeys(ValidatorKeys_test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  suite *psVar2;
  ValidatorKeys_test *pVVar3;
  ValidatorKeys_test *this_00;
  int iVar4;
  Value *pVVar5;
  long *plVar6;
  undefined8 *puVar7;
  char *value;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  ulong *puVar10;
  undefined8 uVar11;
  size_t sVar12;
  long lVar13;
  bool bVar14;
  Value jv;
  ValidatorKeys keys2;
  path keyFile;
  value_type keyType;
  string subdir;
  KeyType keyType_1;
  string error;
  ValidatorKeys keys;
  KeyFileGuard g;
  Value VStack_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  ValidatorKeys_test *local_448;
  ValueHolder local_440;
  size_t local_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430 [2];
  undefined1 local_410 [40];
  int local_3e8;
  char local_3e4;
  ValueHolder local_3e0;
  long local_3d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0;
  ValueHolder local_3c0;
  undefined8 local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  string local_380;
  string local_360;
  KeyType local_33c;
  undefined1 *local_338;
  char *local_330;
  undefined1 local_328;
  undefined7 uStack_327;
  ValueHolder local_318;
  size_t local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308 [2];
  SecretKey local_2e0;
  int local_2c0;
  char local_2bc;
  ios_base local_220 [264];
  KeyFileGuard local_118;
  ValidatorKeys local_f0;
  ValidatorKeys local_90;
  
  local_318.string_ = (char *)local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"Make Validator Keys","");
  psVar2 = (this->super_suite).testcase.suite_;
  psVar2->abort_ = false;
  beast::unit_test::runner::testcase<void>(psVar2->runner_,(string *)&local_318);
  if (local_318 != local_308) {
    operator_delete(local_318.string_,local_308[0]._M_allocated_capacity + 1);
  }
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"test_key_file","");
  local_448 = this;
  local_318.string_ = (char *)local_308;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_318,local_360._M_dataplus._M_p,
             local_360._M_dataplus._M_p + local_360._M_string_length);
  local_440.string_ = (char *)local_430;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"validator_keys.json","");
  boost::filesystem::path::operator/=((path *)&local_318,(path *)&local_440);
  local_3c0.string_ = (char *)&local_3b0;
  if (local_318 == local_308) {
    local_3b0._8_8_ = local_308[0]._8_8_;
  }
  else {
    local_3c0.real_ = local_318.real_;
  }
  local_3b0._M_allocated_capacity = local_308[0]._M_allocated_capacity;
  local_3b8 = local_310;
  local_310 = 0;
  local_308[0]._M_allocated_capacity = local_308[0]._M_allocated_capacity & 0xffffffffffffff00;
  local_318.string_ = (char *)local_308;
  if (local_440 != local_430) {
    operator_delete(local_440.string_,local_430[0]._M_allocated_capacity + 1);
    if (local_318 != local_308) {
      operator_delete(local_318.string_,local_308[0]._M_allocated_capacity + 1);
    }
  }
  pVVar3 = local_448;
  lVar13 = 0x328;
  do {
    local_3a0._M_dataplus._M_p._0_4_ =
         *(undefined4 *)((long)&(pVVar3->super_suite)._vptr_suite + lVar13);
    ValidatorKeys::ValidatorKeys((ValidatorKeys *)&local_318,(KeyType *)&local_3a0);
    KeyFileGuard::KeyFileGuard(&local_118,&pVVar3->super_suite,&local_360);
    ValidatorKeys::writeToFile((ValidatorKeys *)&local_318,(path *)&local_3c0);
    boost::filesystem::detail::status
              ((detail *)&local_440.bool_,(path *)&local_3c0,(error_code *)0x0);
    local_338 = (undefined1 *)CONCAT71(local_338._1_7_,1 < local_440.uint_);
    beast::unit_test::suite::expect<bool,char[1]>
              (&local_448->super_suite,(bool *)&local_338,(char (*) [1])0x27c375,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
               ,0x4a);
    ValidatorKeys::make_ValidatorKeys((ValidatorKeys *)&local_440,(path *)&local_3c0);
    if ((((local_2bc == local_3e4) && (local_318.int_ == local_440.int_)) &&
        (local_2c0 == local_3e8)) && (local_310 == local_438)) {
      iVar4 = bcmp(local_308,local_430,local_310);
      bVar14 = iVar4 == 0;
    }
    else {
      bVar14 = false;
    }
    local_338 = (undefined1 *)CONCAT71(local_338._1_7_,bVar14);
    beast::unit_test::suite::expect<bool,char[1]>
              (&local_448->super_suite,(bool *)&local_338,(char (*) [1])0x27c375,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
               ,0x4d);
    SecretKey::~SecretKey((SecretKey *)(local_410 + 8));
    KeyFileGuard::~KeyFileGuard(&local_118);
    SecretKey::~SecretKey(&local_2e0);
    this_00 = local_448;
    lVar13 = lVar13 + 4;
  } while (lVar13 != 0x330);
  KeyFileGuard::KeyFileGuard(&local_118,&local_448->super_suite,&local_360);
  std::operator+(&local_3a0,"Failed to open key file: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3c0);
  local_330 = (char *)0x0;
  local_328 = 0;
  local_338 = &local_328;
  ValidatorKeys::make_ValidatorKeys(&local_90,(path *)&local_3c0);
  SecretKey::~SecretKey(&local_90.secretKey_);
  if (local_330 == (char *)local_3a0._M_string_length) {
    if (local_330 == (char *)0x0) {
      bVar14 = true;
    }
    else {
      iVar4 = bcmp(local_338,
                   (void *)CONCAT44(local_3a0._M_dataplus._M_p._4_4_,
                                    local_3a0._M_dataplus._M_p._0_4_),(size_t)local_330);
      bVar14 = iVar4 == 0;
    }
  }
  else {
    bVar14 = false;
  }
  local_318.bool_ = bVar14;
  beast::unit_test::suite::expect<bool,char[1]>
            (&this_00->super_suite,&local_318.bool_,(char (*) [1])0x27c375,
             "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
             ,0x5b);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_318,
                 "Unable to parse json key file: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3c0);
  std::__cxx11::string::operator=((string *)&local_3a0,(string *)&local_318.bool_);
  if (local_318 != local_308) {
    operator_delete(local_318.string_,local_308[0]._M_allocated_capacity + 1);
  }
  std::ofstream::ofstream(&local_318,(string *)&local_3c0.bool_,_S_trunc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_318,"{{}",3);
  std::ofstream::close();
  local_318.string_ = _VTT;
  *(undefined8 *)((long)&local_318 + *(long *)(_VTT + -0x18)) = _pthread_attr_getdetachstate;
  std::filebuf::~filebuf((filebuf *)&local_310);
  std::ios_base::~ios_base(local_220);
  ValidatorKeys::make_ValidatorKeys(&local_f0,(path *)&local_3c0);
  SecretKey::~SecretKey(&local_f0.secretKey_);
  if (local_330 == (char *)local_3a0._M_string_length) {
    if (local_330 == (char *)0x0) {
      bVar14 = true;
    }
    else {
      iVar4 = bcmp(local_338,
                   (void *)CONCAT44(local_3a0._M_dataplus._M_p._4_4_,
                                    local_3a0._M_dataplus._M_p._0_4_),(size_t)local_330);
      bVar14 = iVar4 == 0;
    }
  }
  else {
    bVar14 = false;
  }
  local_318.bool_ = bVar14;
  beast::unit_test::suite::expect<bool,char[1]>
            (&this_00->super_suite,&local_318.bool_,(char (*) [1])0x27c375,
             "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
             ,0x6b);
  Json::Value::Value(&VStack_478,nullValue);
  Json::Value::Value((Value *)&local_318,"field");
  pVVar5 = Json::Value::operator[](&VStack_478,"dummy");
  Json::Value::operator=(pVVar5,(Value *)&local_318);
  Json::Value::~Value((Value *)&local_318);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_440,
                 "Key file \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3c0);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_440.int_);
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 == paVar8) {
    local_308[0]._0_8_ = paVar8->_M_allocated_capacity;
    local_308[0]._8_8_ = plVar6[3];
    local_318.string_ = (char *)local_308;
  }
  else {
    local_308[0]._0_8_ = paVar8->_M_allocated_capacity;
    local_318.string_ = (char *)*plVar6;
  }
  local_310 = plVar6[1];
  *plVar6 = (long)paVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_3a0,(string *)&local_318.bool_);
  if (local_318 != local_308) {
    operator_delete(local_318.string_,local_308[0]._M_allocated_capacity + 1);
  }
  if (local_440 != local_430) {
    operator_delete(local_440.string_,local_430[0]._M_allocated_capacity + 1);
  }
  testKeyFile(this_00,(path *)&local_3c0,&VStack_478,&local_3a0);
  Json::Value::Value((Value *)&local_318,"dummy keytype");
  pVVar5 = Json::Value::operator[](&VStack_478,"key_type");
  Json::Value::operator=(pVVar5,(Value *)&local_318);
  Json::Value::~Value((Value *)&local_318);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_440,
                 "Key file \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3c0);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_440.int_);
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 == paVar8) {
    local_308[0]._0_8_ = paVar8->_M_allocated_capacity;
    local_308[0]._8_8_ = plVar6[3];
    local_318.string_ = (char *)local_308;
  }
  else {
    local_308[0]._0_8_ = paVar8->_M_allocated_capacity;
    local_318.string_ = (char *)*plVar6;
  }
  local_310 = plVar6[1];
  *plVar6 = (long)paVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_3a0,(string *)&local_318.bool_);
  if (local_318 != local_308) {
    operator_delete(local_318.string_,local_308[0]._M_allocated_capacity + 1);
  }
  if (local_440 != local_430) {
    operator_delete(local_440.string_,local_430[0]._M_allocated_capacity + 1);
  }
  testKeyFile(this_00,(path *)&local_3c0,&VStack_478,&local_3a0);
  Json::Value::Value((Value *)&local_318,"dummy secret");
  pVVar5 = Json::Value::operator[](&VStack_478,"secret_key");
  Json::Value::operator=(pVVar5,(Value *)&local_318);
  Json::Value::~Value((Value *)&local_318);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_440,
                 "Key file \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3c0);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_440.int_);
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 == paVar8) {
    local_308[0]._0_8_ = paVar8->_M_allocated_capacity;
    local_308[0]._8_8_ = plVar6[3];
    local_318.string_ = (char *)local_308;
  }
  else {
    local_308[0]._0_8_ = paVar8->_M_allocated_capacity;
    local_318.string_ = (char *)*plVar6;
  }
  local_310 = plVar6[1];
  *plVar6 = (long)paVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_3a0,(string *)&local_318.bool_);
  if (local_318 != local_308) {
    operator_delete(local_318.string_,local_308[0]._M_allocated_capacity + 1);
  }
  if (local_440 != local_430) {
    operator_delete(local_440.string_,local_430[0]._M_allocated_capacity + 1);
  }
  testKeyFile(this_00,(path *)&local_3c0,&VStack_478,&local_3a0);
  Json::Value::Value((Value *)&local_318,"dummy sequence");
  pVVar5 = Json::Value::operator[](&VStack_478,"token_sequence");
  Json::Value::operator=(pVVar5,(Value *)&local_318);
  Json::Value::~Value((Value *)&local_318);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_440,
                 "Key file \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3c0);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_440.int_);
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 == paVar8) {
    local_308[0]._0_8_ = paVar8->_M_allocated_capacity;
    local_308[0]._8_8_ = plVar6[3];
    local_318.string_ = (char *)local_308;
  }
  else {
    local_308[0]._0_8_ = paVar8->_M_allocated_capacity;
    local_318.string_ = (char *)*plVar6;
  }
  local_310 = plVar6[1];
  *plVar6 = (long)paVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_3a0,(string *)&local_318.bool_);
  if (local_318 != local_308) {
    operator_delete(local_318.string_,local_308[0]._M_allocated_capacity + 1);
  }
  if (local_440 != local_430) {
    operator_delete(local_440.string_,local_430[0]._M_allocated_capacity + 1);
  }
  testKeyFile(this_00,(path *)&local_3c0,&VStack_478,&local_3a0);
  Json::Value::Value((Value *)&local_318,"dummy revoked");
  pVVar5 = Json::Value::operator[](&VStack_478,"revoked");
  Json::Value::operator=(pVVar5,(Value *)&local_318);
  Json::Value::~Value((Value *)&local_318);
  std::operator+(&local_468,"Key file \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3c0);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_468);
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 == paVar9) {
    local_430[0]._0_8_ = paVar9->_M_allocated_capacity;
    local_430[0]._8_8_ = plVar6[3];
    local_440.string_ = (char *)local_430;
  }
  else {
    local_430[0]._0_8_ = paVar9->_M_allocated_capacity;
    local_440.string_ = (char *)*plVar6;
  }
  local_438 = plVar6[1];
  *plVar6 = (long)paVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  pVVar5 = Json::Value::operator[](&VStack_478,"key_type");
  Json::Value::toStyledString_abi_cxx11_((string *)&local_3e0,pVVar5);
  uVar11 = 0xf;
  if (local_440 != local_430) {
    uVar11 = local_430[0]._M_allocated_capacity;
  }
  if ((ulong)uVar11 < local_3d8 + local_438) {
    uVar11 = 0xf;
    if (local_3e0 != &local_3d0) {
      uVar11 = local_3d0._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_3d8 + local_438) goto LAB_0019b460;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_3e0,0,(char *)0x0,(ulong)local_440);
  }
  else {
LAB_0019b460:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_440.int_,(ulong)local_3e0)
    ;
  }
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 == paVar8) {
    local_308[0]._0_8_ = paVar8->_M_allocated_capacity;
    local_308[0]._8_8_ = puVar7[3];
    local_318.string_ = (char *)local_308;
  }
  else {
    local_308[0]._0_8_ = paVar8->_M_allocated_capacity;
    local_318.string_ = (char *)*puVar7;
  }
  local_310 = puVar7[1];
  *puVar7 = paVar8;
  puVar7[1] = 0;
  paVar8->_M_local_buf[0] = '\0';
  std::__cxx11::string::operator=((string *)&local_3a0,(string *)&local_318.bool_);
  if (local_318 != local_308) {
    operator_delete(local_318.string_,local_308[0]._M_allocated_capacity + 1);
  }
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0.string_,local_3d0._M_allocated_capacity + 1);
  }
  if (local_440 != local_430) {
    operator_delete(local_440.string_,local_430[0]._M_allocated_capacity + 1);
  }
  paVar8 = &local_468.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != paVar8) {
    operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
  }
  testKeyFile(this_00,(path *)&local_3c0,&VStack_478,&local_3a0);
  local_33c = ed25519;
  value = to_string(ed25519);
  Json::Value::Value((Value *)&local_318,value);
  pVVar5 = Json::Value::operator[](&VStack_478,"key_type");
  Json::Value::operator=(pVVar5,(Value *)&local_318);
  Json::Value::~Value((Value *)&local_318);
  std::operator+(&local_468,"Key file \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3c0);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_468);
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 == paVar9) {
    local_430[0]._0_8_ = paVar9->_M_allocated_capacity;
    local_430[0]._8_8_ = plVar6[3];
    local_440.string_ = (char *)local_430;
  }
  else {
    local_430[0]._0_8_ = paVar9->_M_allocated_capacity;
    local_440.string_ = (char *)*plVar6;
  }
  local_438 = plVar6[1];
  *plVar6 = (long)paVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  pVVar5 = Json::Value::operator[](&VStack_478,"secret_key");
  Json::Value::toStyledString_abi_cxx11_((string *)&local_3e0,pVVar5);
  uVar11 = 0xf;
  if (local_440 != local_430) {
    uVar11 = local_430[0]._M_allocated_capacity;
  }
  sVar12 = local_438;
  if ((ulong)uVar11 < local_3d8 + local_438) {
    uVar11 = 0xf;
    if (local_3e0 != &local_3d0) {
      uVar11 = local_3d0._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_3d8 + local_438) goto LAB_0019b6a6;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_3e0,0,(char *)0x0,(ulong)local_440);
  }
  else {
LAB_0019b6a6:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_440.int_,(ulong)local_3e0)
    ;
  }
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 == paVar1) {
    local_308[0]._0_8_ = paVar1->_M_allocated_capacity;
    local_308[0]._8_8_ = puVar7[3];
    local_318.string_ = (char *)local_308;
  }
  else {
    local_308[0]._0_8_ = paVar1->_M_allocated_capacity;
    local_318.string_ = (char *)*puVar7;
  }
  local_310 = puVar7[1];
  *puVar7 = paVar1;
  puVar7[1] = 0;
  paVar1->_M_local_buf[0] = '\0';
  std::__cxx11::string::operator=((string *)&local_3a0,(string *)&local_318.bool_);
  if (local_318 != local_308) {
    operator_delete(local_318.string_,local_308[0]._M_allocated_capacity + 1);
  }
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0.string_,local_3d0._M_allocated_capacity + 1);
  }
  if (local_440 != local_430) {
    operator_delete(local_440.string_,local_430[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != paVar8) {
    operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
  }
  testKeyFile(this_00,(path *)&local_3c0,&VStack_478,&local_3a0);
  ValidatorKeys::ValidatorKeys((ValidatorKeys *)&local_318,&local_33c);
  randomSeed();
  generateKeyPair((pair<jbcoin::PublicKey,_jbcoin::SecretKey> *)&local_440,ed25519,
                  (Seed *)&local_468);
  Seed::~Seed((Seed *)&local_468);
  base58EncodeToken_abi_cxx11_
            (&local_468,(jbcoin *)&DAT_00000020,(uint8_t)(SecretKey *)local_410,&DAT_00000020,sVar12
            );
  Json::Value::Value((Value *)&local_3e0,&local_468);
  pVVar5 = Json::Value::operator[](&VStack_478,"secret_key");
  Json::Value::operator=(pVVar5,(Value *)&local_3e0);
  Json::Value::~Value((Value *)&local_3e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != paVar8) {
    operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
  }
  SecretKey::~SecretKey((SecretKey *)local_410);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3e0,
                 "Key file \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3c0);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_3e0.int_);
  puVar10 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_468.field_2._M_allocated_capacity = *puVar10;
    local_468.field_2._8_8_ = plVar6[3];
    local_468._M_dataplus._M_p = (pointer)paVar8;
  }
  else {
    local_468.field_2._M_allocated_capacity = *puVar10;
    local_468._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_468._M_string_length = plVar6[1];
  *plVar6 = (long)puVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  pVVar5 = Json::Value::operator[](&VStack_478,"token_sequence");
  Json::Value::toStyledString_abi_cxx11_(&local_380,pVVar5);
  uVar11 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != paVar8) {
    uVar11 = local_468.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar11 < local_380._M_string_length + local_468._M_string_length) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      uVar11 = local_380.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_380._M_string_length + local_468._M_string_length) goto LAB_0019b950;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_380,0,(char *)0x0,(ulong)local_468._M_dataplus._M_p);
  }
  else {
LAB_0019b950:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_468,(ulong)local_380._M_dataplus._M_p);
  }
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 == paVar9) {
    local_430[0]._0_8_ = paVar9->_M_allocated_capacity;
    local_430[0]._8_8_ = puVar7[3];
    local_440.string_ = (char *)local_430;
  }
  else {
    local_430[0]._0_8_ = paVar9->_M_allocated_capacity;
    local_440.string_ = (char *)*puVar7;
  }
  local_438 = puVar7[1];
  *puVar7 = paVar9;
  puVar7[1] = 0;
  paVar9->_M_local_buf[0] = '\0';
  std::__cxx11::string::operator=((string *)&local_3a0,(string *)&local_440.bool_);
  if (local_440 != local_430) {
    operator_delete(local_440.string_,local_430[0]._M_allocated_capacity + 1);
  }
  paVar1 = &local_380.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != paVar1) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != paVar8) {
    operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
  }
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0.string_,local_3d0._M_allocated_capacity + 1);
  }
  testKeyFile(local_448,(path *)&local_3c0,&VStack_478,&local_3a0);
  Json::Value::Value((Value *)&local_440,-1);
  pVVar5 = Json::Value::operator[](&VStack_478,"token_sequence");
  Json::Value::operator=(pVVar5,(Value *)&local_440);
  Json::Value::~Value((Value *)&local_440);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3e0,
                 "Key file \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3c0);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_3e0.int_);
  puVar10 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_468.field_2._M_allocated_capacity = *puVar10;
    local_468.field_2._8_8_ = plVar6[3];
    local_468._M_dataplus._M_p = (pointer)paVar8;
  }
  else {
    local_468.field_2._M_allocated_capacity = *puVar10;
    local_468._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_468._M_string_length = plVar6[1];
  *plVar6 = (long)puVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  pVVar5 = Json::Value::operator[](&VStack_478,"token_sequence");
  Json::Value::toStyledString_abi_cxx11_(&local_380,pVVar5);
  uVar11 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != paVar8) {
    uVar11 = local_468.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar11 < local_380._M_string_length + local_468._M_string_length) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != paVar1) {
      uVar11 = local_380.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_380._M_string_length + local_468._M_string_length) goto LAB_0019bb66;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_380,0,(char *)0x0,(ulong)local_468._M_dataplus._M_p);
  }
  else {
LAB_0019bb66:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_468,(ulong)local_380._M_dataplus._M_p);
  }
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 == paVar9) {
    local_430[0]._0_8_ = paVar9->_M_allocated_capacity;
    local_430[0]._8_8_ = puVar7[3];
    local_440.string_ = (char *)local_430;
  }
  else {
    local_430[0]._0_8_ = paVar9->_M_allocated_capacity;
    local_440.string_ = (char *)*puVar7;
  }
  local_438 = puVar7[1];
  *puVar7 = paVar9;
  puVar7[1] = 0;
  paVar9->_M_local_buf[0] = '\0';
  std::__cxx11::string::operator=((string *)&local_3a0,(string *)&local_440.bool_);
  if (local_440 != local_430) {
    operator_delete(local_440.string_,local_430[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != paVar1) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != paVar8) {
    operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
  }
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0.string_,local_3d0._M_allocated_capacity + 1);
  }
  testKeyFile(local_448,(path *)&local_3c0,&VStack_478,&local_3a0);
  Json::Value::Value((Value *)&local_440,0xffffffff);
  pVVar5 = Json::Value::operator[](&VStack_478,"token_sequence");
  Json::Value::operator=(pVVar5,(Value *)&local_440);
  Json::Value::~Value((Value *)&local_440);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3e0,
                 "Key file \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3c0);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_3e0.int_);
  puVar10 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_468.field_2._M_allocated_capacity = *puVar10;
    local_468.field_2._8_8_ = plVar6[3];
    local_468._M_dataplus._M_p = (pointer)paVar8;
  }
  else {
    local_468.field_2._M_allocated_capacity = *puVar10;
    local_468._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_468._M_string_length = plVar6[1];
  *plVar6 = (long)puVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  pVVar5 = Json::Value::operator[](&VStack_478,"revoked");
  Json::Value::toStyledString_abi_cxx11_(&local_380,pVVar5);
  uVar11 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != paVar8) {
    uVar11 = local_468.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar11 < local_380._M_string_length + local_468._M_string_length) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != paVar1) {
      uVar11 = local_380.field_2._M_allocated_capacity;
    }
    if (local_380._M_string_length + local_468._M_string_length <= (ulong)uVar11) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_380,0,(char *)0x0,(ulong)local_468._M_dataplus._M_p);
      goto LAB_0019bd95;
    }
  }
  puVar7 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_468,(ulong)local_380._M_dataplus._M_p);
LAB_0019bd95:
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 == paVar9) {
    local_430[0]._0_8_ = paVar9->_M_allocated_capacity;
    local_430[0]._8_8_ = puVar7[3];
    local_440.string_ = (char *)local_430;
  }
  else {
    local_430[0]._0_8_ = paVar9->_M_allocated_capacity;
    local_440.string_ = (char *)*puVar7;
  }
  local_438 = puVar7[1];
  *puVar7 = paVar9;
  puVar7[1] = 0;
  paVar9->_M_local_buf[0] = '\0';
  std::__cxx11::string::operator=((string *)&local_3a0,(string *)&local_440.bool_);
  if (local_440 != local_430) {
    operator_delete(local_440.string_,local_430[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != paVar1) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  pVVar3 = local_448;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != paVar8) {
    operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
  }
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0.string_,local_3d0._M_allocated_capacity + 1);
  }
  testKeyFile(pVVar3,(path *)&local_3c0,&VStack_478,&local_3a0);
  Json::Value::Value((Value *)&local_440,false);
  pVVar5 = Json::Value::operator[](&VStack_478,"revoked");
  Json::Value::operator=(pVVar5,(Value *)&local_440);
  Json::Value::~Value((Value *)&local_440);
  std::__cxx11::string::_M_replace((ulong)&local_3a0,0,(char *)local_3a0._M_string_length,0x27c375);
  testKeyFile(local_448,(path *)&local_3c0,&VStack_478,&local_3a0);
  Json::Value::Value((Value *)&local_440,true);
  pVVar5 = Json::Value::operator[](&VStack_478,"revoked");
  pVVar3 = local_448;
  Json::Value::operator=(pVVar5,(Value *)&local_440);
  Json::Value::~Value((Value *)&local_440);
  testKeyFile(pVVar3,(path *)&local_3c0,&VStack_478,&local_3a0);
  SecretKey::~SecretKey(&local_2e0);
  Json::Value::~Value(&VStack_478);
  if (local_338 != &local_328) {
    operator_delete(local_338,CONCAT71(uStack_327,local_328) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_3a0._M_dataplus._M_p._4_4_,local_3a0._M_dataplus._M_p._0_4_) !=
      &local_3a0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_3a0._M_dataplus._M_p._4_4_,local_3a0._M_dataplus._M_p._0_4_),
                    local_3a0.field_2._M_allocated_capacity + 1);
  }
  KeyFileGuard::~KeyFileGuard(&local_118);
  if (local_3c0 != &local_3b0) {
    operator_delete(local_3c0.string_,local_3b0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
    testMakeValidatorKeys ()
    {
        testcase ("Make Validator Keys");

        using namespace boost::filesystem;

        std::string const subdir = "test_key_file";
        path const keyFile = subdir / "validator_keys.json";

        for (auto const keyType : keyTypes)
        {
            ValidatorKeys const keys (keyType);

            KeyFileGuard const g (*this, subdir);

            keys.writeToFile (keyFile);
            BEAST_EXPECT (exists (keyFile));

            auto const keys2 = ValidatorKeys::make_ValidatorKeys (keyFile);
            BEAST_EXPECT (keys == keys2);
        }
        {
            // Require expected fields
            KeyFileGuard g (*this, subdir);

            auto expectedError =
                "Failed to open key file: " + keyFile.string();
            std::string error;
            try {
                ValidatorKeys::make_ValidatorKeys (keyFile);
            } catch (std::runtime_error& e) {
                error = e.what();
            }
            BEAST_EXPECT(error == expectedError);

            expectedError =
                "Unable to parse json key file: " + keyFile.string();

            {
                std::ofstream o (keyFile.string (), std::ios_base::trunc);
                o << "{{}";
                o.close();
            }

            try {
                ValidatorKeys::make_ValidatorKeys (keyFile);
            } catch (std::runtime_error& e) {
                error = e.what();
            }
            BEAST_EXPECT(error == expectedError);

            Json::Value jv;
            jv["dummy"] = "field";
            expectedError = "Key file '" + keyFile.string() +
                "' is missing \"key_type\" field";
            testKeyFile (keyFile, jv, expectedError);

            jv["key_type"] = "dummy keytype";
            expectedError = "Key file '" + keyFile.string() +
                "' is missing \"secret_key\" field";
            testKeyFile (keyFile, jv, expectedError);

            jv["secret_key"] = "dummy secret";
            expectedError = "Key file '" + keyFile.string() +
                "' is missing \"token_sequence\" field";
            testKeyFile (keyFile, jv, expectedError);

            jv["token_sequence"] = "dummy sequence";
            expectedError = "Key file '" + keyFile.string() +
                "' is missing \"revoked\" field";
            testKeyFile (keyFile, jv, expectedError);

            jv["revoked"] = "dummy revoked";
            expectedError = "Key file '" + keyFile.string() +
                "' contains invalid \"key_type\" field: " +
                jv["key_type"].toStyledString();
            testKeyFile (keyFile, jv, expectedError);

            auto const keyType = KeyType::ed25519;
            jv["key_type"] = to_string(keyType);
            expectedError = "Key file '" + keyFile.string() +
                "' contains invalid \"secret_key\" field: " +
                jv["secret_key"].toStyledString();
            testKeyFile (keyFile, jv, expectedError);

            ValidatorKeys const keys (keyType);
            {
                auto const kp = generateKeyPair (keyType, randomSeed ());
                jv["secret_key"] =
                    toBase58(TOKEN_NODE_PRIVATE, kp.second);
            }
            expectedError = "Key file '" + keyFile.string() +
                "' contains invalid \"token_sequence\" field: " +
                jv["token_sequence"].toStyledString();
            testKeyFile (keyFile, jv, expectedError);

            jv["token_sequence"] = -1;
            expectedError = "Key file '" + keyFile.string() +
                "' contains invalid \"token_sequence\" field: " +
                jv["token_sequence"].toStyledString();
            testKeyFile (keyFile, jv, expectedError);

            jv["token_sequence"] =
                Json::UInt(std::numeric_limits<std::uint32_t>::max ());
            expectedError = "Key file '" + keyFile.string() +
                "' contains invalid \"revoked\" field: " +
                jv["revoked"].toStyledString();
            testKeyFile (keyFile, jv, expectedError);

            jv["revoked"] = false;
            expectedError = "";
            testKeyFile (keyFile, jv, expectedError);

            jv["revoked"] = true;
            testKeyFile (keyFile, jv, expectedError);
        }
    }